

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

iuIParamGenerator<int> * __thiscall
iutest::detail::iuConcatParamHolder::operator_cast_to_iuIParamGenerator_(iuConcatParamHolder *this)

{
  iuIParamGenerator<int> *piVar1;
  iuValuesInParamsGenerator<int> *this_00;
  undefined1 local_28 [8];
  params_t<int> params;
  iuConcatParamHolder<iutest::detail::iuConcatParamHolder<iutest::detail::iuParamGenerator<int>,_iutest::detail::iuParamGenerator<bool>_>,_iutest::detail::iuValueArray<int,_int>_>
  *this_local;
  
  params.val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  iuConcatParamHolder<iutest::detail::iuConcatParamHolder<iutest::detail::iuParamGenerator<int>,_iutest::detail::iuParamGenerator<bool>_>,_iutest::detail::iuValueArray<int,_int>_>
  ::params_t<int>::params_t((params_t<int> *)local_28);
  piVar1 = operator_cast_to_iuIParamGenerator_(this);
  iuConcatParamHolder<iutest::detail::iuConcatParamHolder<iutest::detail::iuParamGenerator<int>,_iutest::detail::iuParamGenerator<bool>_>,_iutest::detail::iuValueArray<int,_int>_>
  ::params_t<int>::append((params_t<int> *)local_28,piVar1);
  piVar1 = iuValueArray::operator_cast_to_iuIParamGenerator_((iuValueArray *)(this + 0x20));
  iuConcatParamHolder<iutest::detail::iuConcatParamHolder<iutest::detail::iuParamGenerator<int>,_iutest::detail::iuParamGenerator<bool>_>,_iutest::detail::iuValueArray<int,_int>_>
  ::params_t<int>::append((params_t<int> *)local_28,piVar1);
  this_00 = (iuValuesInParamsGenerator<int> *)operator_new(0x28);
  iuValuesInParamsGenerator<int>::iuValuesInParamsGenerator(this_00,(params_t *)local_28);
  iuConcatParamHolder<iutest::detail::iuConcatParamHolder<iutest::detail::iuParamGenerator<int>,_iutest::detail::iuParamGenerator<bool>_>,_iutest::detail::iuValueArray<int,_int>_>
  ::params_t<int>::~params_t((params_t<int> *)local_28);
  return &this_00->super_iuIParamGenerator<int>;
}

Assistant:

operator iuIParamGenerator<T>* ()
    {
        params_t<T> params;
        params.append(m_g1);
        params.append(m_g2);
        return new iuValuesInParamsGenerator<T>(params.val);
    }